

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

int xmlBufferResize(xmlBufferPtr buf,uint size)

{
  xmlBufferAllocationScheme xVar1;
  uint uVar2;
  xmlChar *pxVar3;
  uint uVar4;
  ulong uVar5;
  char *extra;
  ulong uVar6;
  
  if (buf == (xmlBufferPtr)0x0) {
    return 0;
  }
  xVar1 = buf->alloc;
  if (xVar1 == XML_BUFFER_ALLOC_IMMUTABLE) {
    return 0;
  }
  uVar2 = buf->size;
  if (size < uVar2) {
    return 1;
  }
  if (0xfffffff5 < size) {
    extra = "growing buffer past UINT_MAX";
    goto LAB_00188719;
  }
  switch(xVar1) {
  case XML_BUFFER_ALLOC_DOUBLEIT:
  case XML_BUFFER_ALLOC_IO:
    uVar5 = (ulong)(size + 10);
    if (uVar2 != 0) {
      uVar5 = (ulong)uVar2;
    }
    while (uVar4 = (uint)uVar5, uVar4 < size) {
      if ((int)uVar4 < 0) goto LAB_00188712;
      uVar5 = (ulong)(uVar4 * 2);
    }
    break;
  default:
    size = size + 10;
LAB_0018860b:
    uVar5 = (ulong)size;
    break;
  case XML_BUFFER_ALLOC_HYBRID:
    if (buf->use < 0x1000) goto LAB_0018860b;
    uVar5 = (ulong)uVar2;
    if (uVar2 < size) {
      uVar5 = (ulong)uVar2;
      do {
        if ((int)uVar5 < 0) goto LAB_00188712;
        uVar4 = (int)uVar5 * 2;
        uVar5 = (ulong)uVar4;
      } while (uVar4 < size);
    }
  }
  if ((xVar1 == XML_BUFFER_ALLOC_IO) && (pxVar3 = buf->contentIO, pxVar3 != (xmlChar *)0x0)) {
    uVar6 = (long)buf->content - (long)pxVar3;
    if (uVar5 < uVar6) {
      memmove(pxVar3,buf->content,(ulong)buf->use);
      buf->content = buf->contentIO;
      buf->contentIO[buf->use] = '\0';
      buf->size = buf->size + (int)uVar6;
      goto LAB_0018870c;
    }
    pxVar3 = (xmlChar *)(*xmlRealloc)(pxVar3,uVar5 + uVar6);
    if (pxVar3 != (xmlChar *)0x0) {
      buf->contentIO = pxVar3;
      pxVar3 = pxVar3 + uVar6;
      goto LAB_00188709;
    }
  }
  else {
    if (buf->content == (xmlChar *)0x0) {
      pxVar3 = (xmlChar *)(*xmlMallocAtomic)(uVar5);
      buf->use = 0;
      *pxVar3 = '\0';
    }
    else if (uVar2 - buf->use < 100) {
      pxVar3 = (xmlChar *)(*xmlRealloc)(buf->content,uVar5);
    }
    else {
      pxVar3 = (xmlChar *)(*xmlMallocAtomic)(uVar5);
      if (pxVar3 == (xmlChar *)0x0) {
        pxVar3 = (xmlChar *)0x0;
      }
      else {
        memcpy(pxVar3,buf->content,(ulong)buf->use);
        (*xmlFree)(buf->content);
        pxVar3[buf->use] = '\0';
      }
    }
    if (pxVar3 != (xmlChar *)0x0) {
LAB_00188709:
      buf->content = pxVar3;
LAB_0018870c:
      buf->size = (uint)uVar5;
      return 1;
    }
  }
LAB_00188712:
  extra = "growing buffer";
LAB_00188719:
  __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,extra);
  return 0;
}

Assistant:

int
xmlBufferResize(xmlBufferPtr buf, unsigned int size)
{
    unsigned int newSize;
    xmlChar* rebuf = NULL;
    size_t start_buf;

    if (buf == NULL)
        return(0);

    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) return(0);

    /* Don't resize if we don't have to */
    if (size < buf->size)
        return 1;

    if (size > UINT_MAX - 10) {
        xmlTreeErrMemory("growing buffer past UINT_MAX");
        return 0;
    }

    /* figure out new size */
    switch (buf->alloc){
	case XML_BUFFER_ALLOC_IO:
	case XML_BUFFER_ALLOC_DOUBLEIT:
	    /*take care of empty case*/
            if (buf->size == 0)
                newSize = (size > UINT_MAX - 10 ? UINT_MAX : size + 10);
            else
                newSize = buf->size;
	    while (size > newSize) {
	        if (newSize > UINT_MAX / 2) {
	            xmlTreeErrMemory("growing buffer");
	            return 0;
	        }
	        newSize *= 2;
	    }
	    break;
	case XML_BUFFER_ALLOC_EXACT:
	    newSize = (size > UINT_MAX - 10 ? UINT_MAX : size + 10);
	    break;
        case XML_BUFFER_ALLOC_HYBRID:
            if (buf->use < BASE_BUFFER_SIZE)
                newSize = size;
            else {
                newSize = buf->size;
                while (size > newSize) {
                    if (newSize > UINT_MAX / 2) {
                        xmlTreeErrMemory("growing buffer");
                        return 0;
                    }
                    newSize *= 2;
                }
            }
            break;

	default:
	    newSize = (size > UINT_MAX - 10 ? UINT_MAX : size + 10);
	    break;
    }

    if ((buf->alloc == XML_BUFFER_ALLOC_IO) && (buf->contentIO != NULL)) {
        start_buf = buf->content - buf->contentIO;

        if (start_buf > newSize) {
	    /* move data back to start */
	    memmove(buf->contentIO, buf->content, buf->use);
	    buf->content = buf->contentIO;
	    buf->content[buf->use] = 0;
	    buf->size += start_buf;
	} else {
	    rebuf = (xmlChar *) xmlRealloc(buf->contentIO, start_buf + newSize);
	    if (rebuf == NULL) {
		xmlTreeErrMemory("growing buffer");
		return 0;
	    }
	    buf->contentIO = rebuf;
	    buf->content = rebuf + start_buf;
	}
    } else {
	if (buf->content == NULL) {
	    rebuf = (xmlChar *) xmlMallocAtomic(newSize);
	    buf->use = 0;
	    rebuf[buf->use] = 0;
	} else if (buf->size - buf->use < 100) {
	    rebuf = (xmlChar *) xmlRealloc(buf->content, newSize);
        } else {
	    /*
	     * if we are reallocating a buffer far from being full, it's
	     * better to make a new allocation and copy only the used range
	     * and free the old one.
	     */
	    rebuf = (xmlChar *) xmlMallocAtomic(newSize);
	    if (rebuf != NULL) {
		memcpy(rebuf, buf->content, buf->use);
		xmlFree(buf->content);
		rebuf[buf->use] = 0;
	    }
	}
	if (rebuf == NULL) {
	    xmlTreeErrMemory("growing buffer");
	    return 0;
	}
	buf->content = rebuf;
    }
    buf->size = newSize;

    return 1;
}